

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.cpp
# Opt level: O3

void test_qpixl_frqi_util_convert_angles_grayscale<float>(void)

{
  pointer *__ptr;
  char *pcVar1;
  char *pcVar2;
  initializer_list<float> __l;
  initializer_list<float> __l_00;
  vector<float,_std::allocator<float>_> a;
  vector<float,_std::allocator<float>_> a_c;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  in_stack_ffffffffffffff98;
  AssertHelper in_stack_ffffffffffffffa0;
  char local_58 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbStack_50;
  float *in_stack_ffffffffffffffc8;
  float *pfVar3;
  float *in_stack_ffffffffffffffd0;
  pointer in_stack_ffffffffffffffd8;
  vector<float,_std::allocator<float>_> local_20;
  
  local_58[0] = '\0';
  local_58[1] = '\0';
  local_58[2] = -0x80;
  local_58[3] = '?';
  local_58[4] = '\0';
  local_58[5] = '\0';
  local_58[6] = '\0';
  local_58[7] = '@';
  pbStack_50 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               0x4080000040400000;
  __l._M_len = 8;
  __l._M_array = (iterator)local_58;
  std::vector<float,_std::allocator<float>_>::vector
            ((vector<float,_std::allocator<float>_> *)&stack0xffffffffffffffc8,__l,
             (allocator_type *)&local_20);
  pcVar2 = (char *)0x40c0000040a00000;
  local_58[0] = '\0';
  local_58[1] = '\0';
  local_58[2] = -0x80;
  local_58[3] = '?';
  local_58[4] = '\0';
  local_58[5] = '\0';
  local_58[6] = '\0';
  local_58[7] = '@';
  pbStack_50 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               0x4080000040400000;
  __l_00._M_len = 8;
  __l_00._M_array = (iterator)local_58;
  std::vector<float,_std::allocator<float>_>::vector
            (&local_20,__l_00,(allocator_type *)&stack0xffffffffffffff98);
  for (pfVar3 = in_stack_ffffffffffffffc8; pfVar3 != in_stack_ffffffffffffffd0; pfVar3 = pfVar3 + 1)
  {
    *pfVar3 = *pfVar3 * 0.006159986;
  }
  testing::internal::DoubleNearPredFormat
            ((char *)in_stack_ffffffffffffffa0.data_,(char *)in_stack_ffffffffffffff98._M_head_impl,
             pcVar2,(double)in_stack_ffffffffffffffd8,(double)in_stack_ffffffffffffffd0,
             (double)in_stack_ffffffffffffffc8);
  if (local_58[0] == '\0') {
    testing::Message::Message((Message *)&stack0xffffffffffffff98);
    if (pbStack_50 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = (pbStack_50->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&stack0xffffffffffffffa0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qpixlpp/test/frqi/util.cpp"
               ,0x113,pcVar1);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)&stack0xffffffffffffffa0,(Message *)&stack0xffffffffffffff98);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&stack0xffffffffffffffa0);
    if ((__uniq_ptr_data<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
         )in_stack_ffffffffffffff98._M_head_impl !=
        (tuple<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      (**(code **)(*(long *)in_stack_ffffffffffffff98._M_head_impl + 8))();
    }
  }
  if (pbStack_50 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&pbStack_50,pbStack_50);
  }
  testing::internal::DoubleNearPredFormat
            ((char *)in_stack_ffffffffffffffa0.data_,(char *)in_stack_ffffffffffffff98._M_head_impl,
             pcVar2,(double)in_stack_ffffffffffffffd8,(double)in_stack_ffffffffffffffd0,
             (double)in_stack_ffffffffffffffc8);
  if (local_58[0] == '\0') {
    testing::Message::Message((Message *)&stack0xffffffffffffff98);
    if (pbStack_50 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = (pbStack_50->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&stack0xffffffffffffffa0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qpixlpp/test/frqi/util.cpp"
               ,0x114,pcVar1);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)&stack0xffffffffffffffa0,(Message *)&stack0xffffffffffffff98);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&stack0xffffffffffffffa0);
    if ((_Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )in_stack_ffffffffffffff98._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)in_stack_ffffffffffffff98._M_head_impl + 8))();
    }
  }
  if (pbStack_50 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&pbStack_50,pbStack_50);
  }
  testing::internal::DoubleNearPredFormat
            ((char *)in_stack_ffffffffffffffa0.data_,(char *)in_stack_ffffffffffffff98._M_head_impl,
             pcVar2,(double)in_stack_ffffffffffffffd8,(double)in_stack_ffffffffffffffd0,
             (double)in_stack_ffffffffffffffc8);
  if (local_58[0] == '\0') {
    testing::Message::Message((Message *)&stack0xffffffffffffff98);
    if (pbStack_50 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = (pbStack_50->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&stack0xffffffffffffffa0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qpixlpp/test/frqi/util.cpp"
               ,0x115,pcVar1);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)&stack0xffffffffffffffa0,(Message *)&stack0xffffffffffffff98);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&stack0xffffffffffffffa0);
    if ((_Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )in_stack_ffffffffffffff98._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)in_stack_ffffffffffffff98._M_head_impl + 8))();
    }
  }
  if (pbStack_50 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&pbStack_50,pbStack_50);
  }
  testing::internal::DoubleNearPredFormat
            ((char *)in_stack_ffffffffffffffa0.data_,(char *)in_stack_ffffffffffffff98._M_head_impl,
             pcVar2,(double)in_stack_ffffffffffffffd8,(double)in_stack_ffffffffffffffd0,
             (double)in_stack_ffffffffffffffc8);
  if (local_58[0] == '\0') {
    testing::Message::Message((Message *)&stack0xffffffffffffff98);
    if (pbStack_50 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = (pbStack_50->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&stack0xffffffffffffffa0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qpixlpp/test/frqi/util.cpp"
               ,0x116,pcVar1);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)&stack0xffffffffffffffa0,(Message *)&stack0xffffffffffffff98);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&stack0xffffffffffffffa0);
    if ((_Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )in_stack_ffffffffffffff98._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)in_stack_ffffffffffffff98._M_head_impl + 8))();
    }
  }
  if (pbStack_50 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&pbStack_50,pbStack_50);
  }
  testing::internal::DoubleNearPredFormat
            ((char *)in_stack_ffffffffffffffa0.data_,(char *)in_stack_ffffffffffffff98._M_head_impl,
             pcVar2,(double)in_stack_ffffffffffffffd8,(double)in_stack_ffffffffffffffd0,
             (double)in_stack_ffffffffffffffc8);
  if (local_58[0] == '\0') {
    testing::Message::Message((Message *)&stack0xffffffffffffff98);
    if (pbStack_50 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = (pbStack_50->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&stack0xffffffffffffffa0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qpixlpp/test/frqi/util.cpp"
               ,0x117,pcVar1);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)&stack0xffffffffffffffa0,(Message *)&stack0xffffffffffffff98);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&stack0xffffffffffffffa0);
    if ((_Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )in_stack_ffffffffffffff98._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)in_stack_ffffffffffffff98._M_head_impl + 8))();
    }
  }
  if (pbStack_50 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&pbStack_50,pbStack_50);
  }
  testing::internal::DoubleNearPredFormat
            ((char *)in_stack_ffffffffffffffa0.data_,(char *)in_stack_ffffffffffffff98._M_head_impl,
             pcVar2,(double)in_stack_ffffffffffffffd8,(double)in_stack_ffffffffffffffd0,
             (double)in_stack_ffffffffffffffc8);
  if (local_58[0] == '\0') {
    testing::Message::Message((Message *)&stack0xffffffffffffff98);
    if (pbStack_50 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = (pbStack_50->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&stack0xffffffffffffffa0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qpixlpp/test/frqi/util.cpp"
               ,0x118,pcVar1);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)&stack0xffffffffffffffa0,(Message *)&stack0xffffffffffffff98);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&stack0xffffffffffffffa0);
    if ((_Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )in_stack_ffffffffffffff98._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)in_stack_ffffffffffffff98._M_head_impl + 8))();
    }
  }
  if (pbStack_50 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&pbStack_50,pbStack_50);
  }
  testing::internal::DoubleNearPredFormat
            ((char *)in_stack_ffffffffffffffa0.data_,(char *)in_stack_ffffffffffffff98._M_head_impl,
             pcVar2,(double)in_stack_ffffffffffffffd8,(double)in_stack_ffffffffffffffd0,
             (double)in_stack_ffffffffffffffc8);
  if (local_58[0] == '\0') {
    testing::Message::Message((Message *)&stack0xffffffffffffff98);
    if (pbStack_50 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = (pbStack_50->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&stack0xffffffffffffffa0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qpixlpp/test/frqi/util.cpp"
               ,0x119,pcVar1);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)&stack0xffffffffffffffa0,(Message *)&stack0xffffffffffffff98);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&stack0xffffffffffffffa0);
    if ((_Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )in_stack_ffffffffffffff98._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)in_stack_ffffffffffffff98._M_head_impl + 8))();
    }
  }
  if (pbStack_50 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&pbStack_50,pbStack_50);
  }
  testing::internal::DoubleNearPredFormat
            ((char *)in_stack_ffffffffffffffa0.data_,(char *)in_stack_ffffffffffffff98._M_head_impl,
             pcVar2,(double)in_stack_ffffffffffffffd8,(double)in_stack_ffffffffffffffd0,
             (double)in_stack_ffffffffffffffc8);
  if (local_58[0] == '\0') {
    testing::Message::Message((Message *)&stack0xffffffffffffff98);
    if (pbStack_50 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = (pbStack_50->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&stack0xffffffffffffffa0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qpixlpp/test/frqi/util.cpp"
               ,0x11a,pcVar1);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)&stack0xffffffffffffffa0,(Message *)&stack0xffffffffffffff98);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&stack0xffffffffffffffa0);
    if ((_Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )in_stack_ffffffffffffff98._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)in_stack_ffffffffffffff98._M_head_impl + 8))();
    }
  }
  pfVar3 = in_stack_ffffffffffffffc8;
  if (pbStack_50 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&pbStack_50,pbStack_50);
    pfVar3 = in_stack_ffffffffffffffc8;
  }
  for (; in_stack_ffffffffffffffc8 != in_stack_ffffffffffffffd0;
      in_stack_ffffffffffffffc8 = in_stack_ffffffffffffffc8 + 1) {
    *in_stack_ffffffffffffffc8 = *in_stack_ffffffffffffffc8 * 162.33804;
  }
  testing::internal::DoubleNearPredFormat
            ((char *)in_stack_ffffffffffffffa0.data_,(char *)in_stack_ffffffffffffff98._M_head_impl,
             pcVar2,(double)in_stack_ffffffffffffffd8,(double)in_stack_ffffffffffffffd0,
             (double)pfVar3);
  if (local_58[0] == '\0') {
    testing::Message::Message((Message *)&stack0xffffffffffffff98);
    if (pbStack_50 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = (pbStack_50->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&stack0xffffffffffffffa0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qpixlpp/test/frqi/util.cpp"
               ,0x11d,pcVar1);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)&stack0xffffffffffffffa0,(Message *)&stack0xffffffffffffff98);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&stack0xffffffffffffffa0);
    if (in_stack_ffffffffffffff98._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)in_stack_ffffffffffffff98._M_head_impl + 8))();
    }
  }
  if (pbStack_50 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&pbStack_50,pbStack_50);
  }
  testing::internal::DoubleNearPredFormat
            ((char *)in_stack_ffffffffffffffa0.data_,(char *)in_stack_ffffffffffffff98._M_head_impl,
             pcVar2,(double)in_stack_ffffffffffffffd8,(double)in_stack_ffffffffffffffd0,
             (double)pfVar3);
  if (local_58[0] == '\0') {
    testing::Message::Message((Message *)&stack0xffffffffffffff98);
    if (pbStack_50 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = (pbStack_50->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&stack0xffffffffffffffa0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qpixlpp/test/frqi/util.cpp"
               ,0x11e,pcVar1);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)&stack0xffffffffffffffa0,(Message *)&stack0xffffffffffffff98);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&stack0xffffffffffffffa0);
    if ((__uniq_ptr_data<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
         )in_stack_ffffffffffffff98._M_head_impl !=
        (tuple<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      (**(code **)(*(long *)in_stack_ffffffffffffff98._M_head_impl + 8))();
    }
  }
  if (pbStack_50 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&pbStack_50,pbStack_50);
  }
  testing::internal::DoubleNearPredFormat
            ((char *)in_stack_ffffffffffffffa0.data_,(char *)in_stack_ffffffffffffff98._M_head_impl,
             pcVar2,(double)in_stack_ffffffffffffffd8,(double)in_stack_ffffffffffffffd0,
             (double)pfVar3);
  if (local_58[0] == '\0') {
    testing::Message::Message((Message *)&stack0xffffffffffffff98);
    if (pbStack_50 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = (pbStack_50->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&stack0xffffffffffffffa0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qpixlpp/test/frqi/util.cpp"
               ,0x11f,pcVar1);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)&stack0xffffffffffffffa0,(Message *)&stack0xffffffffffffff98);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&stack0xffffffffffffffa0);
    if ((_Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )in_stack_ffffffffffffff98._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)in_stack_ffffffffffffff98._M_head_impl + 8))();
    }
  }
  if (pbStack_50 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&pbStack_50,pbStack_50);
  }
  testing::internal::DoubleNearPredFormat
            ((char *)in_stack_ffffffffffffffa0.data_,(char *)in_stack_ffffffffffffff98._M_head_impl,
             pcVar2,(double)in_stack_ffffffffffffffd8,(double)in_stack_ffffffffffffffd0,
             (double)pfVar3);
  if (local_58[0] == '\0') {
    testing::Message::Message((Message *)&stack0xffffffffffffff98);
    if (pbStack_50 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = (pbStack_50->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&stack0xffffffffffffffa0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qpixlpp/test/frqi/util.cpp"
               ,0x120,pcVar1);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)&stack0xffffffffffffffa0,(Message *)&stack0xffffffffffffff98);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&stack0xffffffffffffffa0);
    if ((_Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )in_stack_ffffffffffffff98._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)in_stack_ffffffffffffff98._M_head_impl + 8))();
    }
  }
  if (pbStack_50 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&pbStack_50,pbStack_50);
  }
  testing::internal::DoubleNearPredFormat
            ((char *)in_stack_ffffffffffffffa0.data_,(char *)in_stack_ffffffffffffff98._M_head_impl,
             pcVar2,(double)in_stack_ffffffffffffffd8,(double)in_stack_ffffffffffffffd0,
             (double)pfVar3);
  if (local_58[0] == '\0') {
    testing::Message::Message((Message *)&stack0xffffffffffffff98);
    if (pbStack_50 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = (pbStack_50->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&stack0xffffffffffffffa0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qpixlpp/test/frqi/util.cpp"
               ,0x121,pcVar1);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)&stack0xffffffffffffffa0,(Message *)&stack0xffffffffffffff98);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&stack0xffffffffffffffa0);
    if ((_Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )in_stack_ffffffffffffff98._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)in_stack_ffffffffffffff98._M_head_impl + 8))();
    }
  }
  if (pbStack_50 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&pbStack_50,pbStack_50);
  }
  testing::internal::DoubleNearPredFormat
            ((char *)in_stack_ffffffffffffffa0.data_,(char *)in_stack_ffffffffffffff98._M_head_impl,
             pcVar2,(double)in_stack_ffffffffffffffd8,(double)in_stack_ffffffffffffffd0,
             (double)pfVar3);
  if (local_58[0] == '\0') {
    testing::Message::Message((Message *)&stack0xffffffffffffff98);
    if (pbStack_50 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = (pbStack_50->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&stack0xffffffffffffffa0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qpixlpp/test/frqi/util.cpp"
               ,0x122,pcVar1);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)&stack0xffffffffffffffa0,(Message *)&stack0xffffffffffffff98);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&stack0xffffffffffffffa0);
    if ((_Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )in_stack_ffffffffffffff98._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)in_stack_ffffffffffffff98._M_head_impl + 8))();
    }
  }
  if (pbStack_50 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&pbStack_50,pbStack_50);
  }
  testing::internal::DoubleNearPredFormat
            ((char *)in_stack_ffffffffffffffa0.data_,(char *)in_stack_ffffffffffffff98._M_head_impl,
             pcVar2,(double)in_stack_ffffffffffffffd8,(double)in_stack_ffffffffffffffd0,
             (double)pfVar3);
  if (local_58[0] == '\0') {
    testing::Message::Message((Message *)&stack0xffffffffffffff98);
    if (pbStack_50 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = (pbStack_50->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&stack0xffffffffffffffa0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qpixlpp/test/frqi/util.cpp"
               ,0x123,pcVar1);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)&stack0xffffffffffffffa0,(Message *)&stack0xffffffffffffff98);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&stack0xffffffffffffffa0);
    if ((_Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )in_stack_ffffffffffffff98._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)in_stack_ffffffffffffff98._M_head_impl + 8))();
    }
  }
  if (pbStack_50 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&pbStack_50,pbStack_50);
  }
  testing::internal::DoubleNearPredFormat
            ((char *)in_stack_ffffffffffffffa0.data_,(char *)in_stack_ffffffffffffff98._M_head_impl,
             pcVar2,(double)in_stack_ffffffffffffffd8,(double)in_stack_ffffffffffffffd0,
             (double)pfVar3);
  if (local_58[0] == '\0') {
    testing::Message::Message((Message *)&stack0xffffffffffffff98);
    if (pbStack_50 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = (pbStack_50->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&stack0xffffffffffffffa0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qpixlpp/test/frqi/util.cpp"
               ,0x124,pcVar2);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)&stack0xffffffffffffffa0,(Message *)&stack0xffffffffffffff98);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&stack0xffffffffffffffa0);
    if ((_Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )in_stack_ffffffffffffff98._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)in_stack_ffffffffffffff98._M_head_impl + 8))();
    }
  }
  if (pbStack_50 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&pbStack_50,pbStack_50);
  }
  if (local_20.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_20.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_20.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_20.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (pfVar3 != (float *)0x0) {
    operator_delete(pfVar3,(long)in_stack_ffffffffffffffd8 - (long)pfVar3);
  }
  return;
}

Assistant:

void test_qpixl_frqi_util_convert_angles_grayscale() {
  std::vector< R > a = { 1 , 2 , 3 , 4 , 5 , 6 , 7 , 8 } ;
  std::vector< R > a_c = { 1 , 2 , 3 , 4 , 5 , 6 , 7 , 8 } ;
  size_t maxval = 255 ;

  const R eps = std::numeric_limits< R >::epsilon() ;
  const R pi2 = 2 * std::atan(1) ;
  const R scal = pi2 / maxval ;

  qpixl::frqi::convertToAngles( a , maxval ) ;
  EXPECT_NEAR( a[ 0] , a_c[ 0]*scal  , 10*eps ) ;
  EXPECT_NEAR( a[ 1] , a_c[ 1]*scal  , 10*eps ) ;
  EXPECT_NEAR( a[ 2] , a_c[ 2]*scal  , 10*eps ) ;
  EXPECT_NEAR( a[ 3] , a_c[ 3]*scal  , 10*eps ) ;
  EXPECT_NEAR( a[ 4] , a_c[ 4]*scal  , 10*eps ) ;
  EXPECT_NEAR( a[ 5] , a_c[ 5]*scal  , 10*eps ) ;
  EXPECT_NEAR( a[ 6] , a_c[ 6]*scal  , 10*eps ) ;
  EXPECT_NEAR( a[ 7] , a_c[ 7]*scal  , 10*eps ) ;
  
  qpixl::frqi::convertToGrayscale( a , maxval ) ;
  EXPECT_NEAR( a[ 0] , a_c[ 0]  , 10*eps ) ;
  EXPECT_NEAR( a[ 1] , a_c[ 1]  , 10*eps ) ;
  EXPECT_NEAR( a[ 2] , a_c[ 2]  , 10*eps ) ;
  EXPECT_NEAR( a[ 3] , a_c[ 3]  , 10*eps ) ;
  EXPECT_NEAR( a[ 4] , a_c[ 4]  , 10*eps ) ;
  EXPECT_NEAR( a[ 5] , a_c[ 5]  , 10*eps ) ;
  EXPECT_NEAR( a[ 6] , a_c[ 6]  , 10*eps ) ;
  EXPECT_NEAR( a[ 7] , a_c[ 7]  , 10*eps ) ;

}